

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O2

void __thiscall
cali::BufferedRegionProfile::fetch_exclusive_region_times
          (BufferedRegionProfile *this,char *region_type)

{
  allocator<char> local_89;
  string local_88;
  region_profile_t local_68;
  double *local_28;
  double *local_20;
  element_type *local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,region_type,&local_89);
  RegionProfile::exclusive_region_times(&local_68,&this->super_RegionProfile,&local_88);
  local_18 = (this->mP).
             super___shared_ptr<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_20 = &local_18->tot_reg_time;
  local_28 = &local_18->tot_time;
  std::
  tuple<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&,double&,double&>
  ::operator=((tuple<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&,double&,double&>
               *)&local_28,&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)&local_68.
                  super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
                  .
                  super__Head_base<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_false>
             );
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void BufferedRegionProfile::fetch_exclusive_region_times(const char* region_type)
{
    std::tie(mP->reg_times, mP->tot_reg_time, mP->tot_time) = exclusive_region_times(region_type);
}